

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O1

void constructor_destroy(constructor ctor)

{
  set *ppsVar1;
  ulong uVar2;
  
  if (ctor != (constructor)0x0) {
    if (ctor->count != 0) {
      ppsVar1 = &ctor[1].map;
      uVar2 = 0;
      do {
        if (*ppsVar1 != (set)0x0) {
          free(*ppsVar1);
        }
        uVar2 = uVar2 + 1;
        ppsVar1 = ppsVar1 + 3;
      } while (uVar2 < ctor->count);
    }
    set_destroy(ctor->map);
    free(ctor);
    return;
  }
  return;
}

Assistant:

void constructor_destroy(constructor ctor)
{
	if (ctor != NULL)
	{
		size_t index;

		for (index = 0; index < ctor->count; ++index)
		{
			constructor_node node = constructor_at(ctor, index);

			if (node != NULL && node->name != NULL)
			{
				free(node->name);
			}
		}

		set_destroy(ctor->map);

		free(ctor);
	}
}